

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall wallet::CWallet::SetupDescriptorScriptPubKeyMans(CWallet *this,CExtKey *master_key)

{
  bool bVar1;
  WalletDatabase *pWVar2;
  long lVar3;
  runtime_error *this_00;
  long lVar4;
  long in_FS_OFFSET;
  OutputType t;
  WalletBatch local_50;
  undefined2 local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar2 = GetDatabase(this);
  (*pWVar2->_vptr_WalletDatabase[0xe])(&local_50,pWVar2,1);
  local_50.m_database = pWVar2;
  bVar1 = WalletBatch::TxnBegin(&local_50);
  if (bVar1) {
    local_3a = 0x100;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      bVar1 = *(bool *)((long)&local_3a + lVar3);
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 4) {
        t = *(OutputType *)((long)OUTPUT_TYPES._M_elems + lVar4);
        SetupDescriptorScriptPubKeyMan(this,&local_50,master_key,&t,bVar1);
      }
    }
    bVar1 = WalletBatch::TxnCommit(&local_50);
    if (bVar1) {
      if (local_50.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0)
      {
        (*(*(_func_int ***)
            local_50.m_batch._M_t.
            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      goto LAB_0047184c;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Error: cannot commit db transaction for descriptors setup");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Error: cannot create db transaction for descriptors setup");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_0047184c:
  __stack_chk_fail();
}

Assistant:

void CWallet::SetupDescriptorScriptPubKeyMans(const CExtKey& master_key)
{
    AssertLockHeld(cs_wallet);

    // Create single batch txn
    WalletBatch batch(GetDatabase());
    if (!batch.TxnBegin()) throw std::runtime_error("Error: cannot create db transaction for descriptors setup");

    for (bool internal : {false, true}) {
        for (OutputType t : OUTPUT_TYPES) {
            SetupDescriptorScriptPubKeyMan(batch, master_key, t, internal);
        }
    }

    // Ensure information is committed to disk
    if (!batch.TxnCommit()) throw std::runtime_error("Error: cannot commit db transaction for descriptors setup");
}